

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_ParseMethodToCommand
          (char *method_name,char **component_name,char **command_name)

{
  LOGGER_LOG p_Var1;
  char *pcVar2;
  char *pcVar3;
  size_t local_60;
  ulong local_58;
  LOGGER_LOG l_1;
  size_t malloc_size;
  size_t component_name_length;
  char *componentSplit;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  char **command_name_local;
  char **component_name_local;
  char *method_name_local;
  
  if (((method_name == (char *)0x0) || (component_name == (char **)0x0)) ||
     (command_name == (char **)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ParseMethodToCommand",0x2f6,1,
                "Invalid parameter for IoTHubClientCore_LL_ParseMethodToCommand");
    }
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
  }
  else {
    pcVar2 = strchr(method_name,0x2a);
    if (pcVar2 == (char *)0x0) {
      *component_name = (char *)0x0;
      *command_name = method_name;
      l._4_4_ = IOTHUB_CLIENT_OK;
    }
    else {
      if (pcVar2 < method_name) {
        local_58 = 0xffffffffffffffff;
      }
      else {
        local_58 = (long)pcVar2 - (long)method_name;
      }
      if (local_58 < 0xfffffffffffffffe) {
        local_60 = local_58 + 1;
      }
      else {
        local_60 = 0xffffffffffffffff;
      }
      if (local_60 != 0xffffffffffffffff) {
        pcVar3 = (char *)malloc(local_60);
        *component_name = pcVar3;
        if (pcVar3 != (char *)0x0) {
          memcpy(*component_name,method_name,local_58);
          (*component_name)[local_58] = '\0';
          *command_name = pcVar2 + 1;
          return IOTHUB_CLIENT_OK;
        }
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_ParseMethodToCommand",0x30a,1,
                  "Cannot allocate component name, size:%zu",local_60);
      }
      l._4_4_ = IOTHUB_CLIENT_ERROR;
      *component_name = (char *)0x0;
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_ParseMethodToCommand(const char* method_name, char** component_name, const char** command_name)
{
    IOTHUB_CLIENT_RESULT result;

    if ((method_name == NULL) || (component_name == NULL) || (command_name == NULL))
    {
        LogError("Invalid parameter for IoTHubClientCore_LL_ParseMethodToCommand");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        const char* componentSplit = strchr(method_name, COMPONENT_DELIMETER);

        if (componentSplit == NULL)
        {
            *component_name = NULL;
            *command_name = method_name;
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            size_t component_name_length = safe_subtract_size_t(componentSplit, method_name);
            size_t malloc_size = safe_add_size_t(component_name_length, 1);
            if (malloc_size == SIZE_MAX ||
                (*component_name = malloc(malloc_size)) == NULL)
            {
                LogError("Cannot allocate component name, size:%zu", malloc_size);
                result = IOTHUB_CLIENT_ERROR;
                *component_name = NULL;
            }
            else
            {
                memcpy(*component_name, method_name, component_name_length);
                (*component_name)[component_name_length] = 0;
                *command_name = componentSplit + 1;
                result = IOTHUB_CLIENT_OK;
            }
        }
    }

    return result;
}